

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

void zisofs_detect_magic(archive_write *a,void *buff,size_t s)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  
  lVar4 = *(long *)&(a->archive).archive_format;
  uVar5 = archive_entry_size(*(archive_entry **)(lVar4 + 0x20));
  uVar11 = 0x40;
  if ((long)uVar5 < 0x40) {
    uVar11 = uVar5;
  }
  iVar12 = *(int *)((long)&a[1].format_write_data + 4);
  lVar6 = (long)iVar12;
  iVar8 = (int)uVar11;
  uVar11 = (ulong)iVar8;
  if ((lVar6 != 0) || (s < uVar11)) {
    if (iVar12 < iVar8) {
      uVar7 = 0x40U - lVar6;
      if (s <= 0x40U - lVar6) {
        uVar7 = s;
      }
      memcpy((void *)((long)&a[1].filter_first + lVar6 + 1),buff,uVar7);
      iVar12 = (int)uVar7 + *(int *)((long)&a[1].format_write_data + 4);
      *(int *)((long)&a[1].format_write_data + 4) = iVar12;
      if (iVar12 < iVar8) {
        return;
      }
    }
    buff = (void *)((long)&a[1].filter_first + 1);
  }
  *(byte *)&a[1].filter_first = *(byte *)&a[1].filter_first & 0xfe;
  if (*buff == 0x7d6dbc99653e437) {
    uVar2 = *(uint *)((long)buff + 8);
    bVar1 = *(byte *)((long)buff + 0xd);
    if ((*(char *)((long)buff + 0xc) == '\x04' && 0x17 < (ulong)uVar2) &&
        0xe7 < (byte)(bVar1 - 0x1f)) {
      uVar9 = (ulong)uVar2 - 1 >> (bVar1 & 0x3f);
      uVar7 = uVar9 * 4 + 0x18;
      if ((long)uVar7 <= (long)uVar5) {
        if (0x17 < (long)uVar11) {
          uVar13 = (long)buff + 0x1c;
          uVar10 = *(uint *)((long)buff + 0x10);
          do {
            if (uVar7 != uVar10) {
              return;
            }
            uVar3 = *(uint *)(uVar13 - 8);
            if (uVar3 < uVar10) {
              return;
            }
            if (uVar5 < uVar3) {
              return;
            }
            bVar14 = uVar9 == 0;
            uVar9 = uVar9 - 1;
            if (bVar14) break;
            uVar7 = uVar7 + (uVar3 - uVar10);
            bVar14 = uVar13 <= uVar11 + (long)buff;
            uVar13 = uVar13 + 4;
            uVar10 = uVar3;
          } while (bVar14);
        }
        *(uint *)(lVar4 + 0xc4) = uVar2;
        *(undefined1 *)(lVar4 + 0xc0) = 4;
        *(byte *)(lVar4 + 0xc1) = bVar1;
        *(byte *)&a[1].filter_first = *(byte *)&a[1].filter_first & 0xfd;
      }
    }
  }
  return;
}

Assistant:

static void
zisofs_detect_magic(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file = iso9660->cur_file;
	const unsigned char *p, *endp;
	const unsigned char *magic_buff;
	uint32_t uncompressed_size;
	unsigned char header_size;
	unsigned char log2_bs;
	size_t _ceil, doff;
	uint32_t bst, bed;
	int magic_max;
	int64_t entry_size;

	entry_size = archive_entry_size(file->entry);
	if ((int64_t)sizeof(iso9660->zisofs.magic_buffer) > entry_size)
		magic_max = (int)entry_size;
	else
		magic_max = sizeof(iso9660->zisofs.magic_buffer);

	if (iso9660->zisofs.magic_cnt == 0 && s >= (size_t)magic_max)
		/* It's unnecessary we copy buffer. */
		magic_buff = buff;
	else {
		if (iso9660->zisofs.magic_cnt < magic_max) {
			size_t l;

			l = sizeof(iso9660->zisofs.magic_buffer)
			    - iso9660->zisofs.magic_cnt;
			if (l > s)
				l = s;
			memcpy(iso9660->zisofs.magic_buffer
			    + iso9660->zisofs.magic_cnt, buff, l);
			iso9660->zisofs.magic_cnt += (int)l;
			if (iso9660->zisofs.magic_cnt < magic_max)
				return;
		}
		magic_buff = iso9660->zisofs.magic_buffer;
	}
	iso9660->zisofs.detect_magic = 0;
	p = magic_buff;

	/* Check the magic code of zisofs. */
	if (memcmp(p, zisofs_magic, sizeof(zisofs_magic)) != 0)
		/* This is not zisofs file which made by mkzftree. */
		return;
	p += sizeof(zisofs_magic);

	/* Read a zisofs header. */
	uncompressed_size = archive_le32dec(p);
	header_size = p[4];
	log2_bs = p[5];
	if (uncompressed_size < 24 || header_size != 4 ||
	    log2_bs > 30 || log2_bs < 7)
		return;/* Invalid or not supported header. */

	/* Calculate a size of Block Pointers of zisofs. */
	_ceil = (uncompressed_size +
	        (ARCHIVE_LITERAL_LL(1) << log2_bs) -1) >> log2_bs;
	doff = (_ceil + 1) * 4 + 16;
	if (entry_size < (int64_t)doff)
		return;/* Invalid data. */

	/* Check every Block Pointer has valid value. */
	p = magic_buff + 16;
	endp = magic_buff + magic_max;
	while (_ceil && p + 8 <= endp) {
		bst = archive_le32dec(p);
		if (bst != doff)
			return;/* Invalid data. */
		p += 4;
		bed = archive_le32dec(p);
		if (bed < bst || bed > entry_size)
			return;/* Invalid data. */
		doff += bed - bst;
		_ceil--;
	}

	file->zisofs.uncompressed_size = uncompressed_size;
	file->zisofs.header_size = header_size;
	file->zisofs.log2_bs = log2_bs;

	/* Disable making a zisofs image. */
	iso9660->zisofs.making = 0;
}